

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  size_t sVar1;
  FILE *__stream;
  char *__s;
  
  __s = anon_var_dwarf_407d6e + 0x11;
  if (premature_exit_filepath != (char *)0x0) {
    __s = premature_exit_filepath;
  }
  (this->premature_exit_filepath_)._M_dataplus._M_p =
       (pointer)&(this->premature_exit_filepath_).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar1);
  if ((this->premature_exit_filepath_)._M_string_length != 0) {
    __stream = fopen(premature_exit_filepath,"w");
    fputc(0x30,__stream);
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(premature_exit_filepath ?
                                 premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath, "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }